

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::
Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
::resize(Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
         *this,SizeT new_size)

{
  SizeT SVar1;
  LoopItem *from;
  LoopItem *to;
  LoopItem *des;
  LoopItem *src;
  SizeT32 type_size;
  SizeT new_size_local;
  Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
  *this_local;
  
  from = Storage(this);
  setCapacity(this,new_size);
  to = allocate(this);
  SVar1 = Size(this);
  Memory::Copy<unsigned_int>(to,from,SVar1 * 0x18);
  Memory::Deallocate(from);
  return;
}

Assistant:

void resize(SizeT new_size) {
        constexpr SizeT32 type_size = sizeof(Type_T);
        Type_T           *src       = Storage();

        setCapacity(new_size);

        Type_T *des = allocate();
        Memory::Copy(des, src, (Size() * type_size));
        Memory::Deallocate(src);
    }